

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::addNewPointerLocation(Union *this)

{
  uint *puVar1;
  uint local_14;
  Union *local_10;
  Union *this_local;
  
  local_10 = this;
  local_14 = (*this->parent->_vptr_StructOrGroup[2])();
  puVar1 = kj::Vector<unsigned_int>::add<unsigned_int>(&this->pointerLocations,&local_14);
  return *puVar1;
}

Assistant:

uint addNewPointerLocation() {
      // Add a whole new pointer location to the union with the given size.

      return pointerLocations.add(parent.addPointer());
    }